

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O2

void __thiscall
dynet::FastLSTMBuilder::FastLSTMBuilder
          (FastLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  ParameterCollection *this_00;
  Parameter PVar1;
  Parameter PVar2;
  Parameter PVar3;
  Parameter PVar4;
  Parameter PVar5;
  Parameter PVar6;
  Parameter PVar7;
  Parameter PVar8;
  Parameter PVar9;
  Parameter PVar10;
  bool bVar11;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<dynet::Parameter> __l;
  uint local_178;
  allocator local_171;
  undefined8 local_170;
  undefined4 local_168;
  ParameterStorage *local_160;
  uint local_154;
  undefined **local_150;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  uint local_124;
  undefined1 local_d0 [72];
  ParameterStorage *local_88;
  ParameterStorage *local_80;
  
  local_160 = (ParameterStorage *)CONCAT44(local_160._4_4_,input_dim);
  (this->super_RNNBuilder).cur = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__FastLSTMBuilder_0070b210;
  this_00 = &this->local_model;
  ParameterCollection::ParameterCollection(this_00);
  (this->c).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layers = layers;
  std::__cxx11::string::string((string *)&ps,"fast-lstm-builder",(allocator *)&local_170);
  ParameterCollection::add_subcollection((ParameterCollection *)local_d0,model,(string *)&ps);
  ParameterCollection::operator=(this_00,(ParameterCollection *)local_d0);
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_d0);
  std::__cxx11::string::~string((string *)&ps);
  local_150 = &PTR__ParameterInit_0070fae0;
  local_154 = hidden_dim;
  local_124 = layers;
  while( true ) {
    bVar11 = local_124 == 0;
    local_124 = local_124 - 1;
    if (bVar11) break;
    local_170 = (undefined **)CONCAT44(local_160._0_4_,hidden_dim);
    x._M_len = 2;
    x._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar1 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(hidden_dim,hidden_dim);
    x_00._M_len = 2;
    x_00._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_00);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar2 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(1,hidden_dim);
    x_01._M_len = 2;
    x_01._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_01);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar3 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_02._M_len = 1;
    x_02._M_array = &local_178;
    local_178 = hidden_dim;
    Dim::Dim((Dim *)local_d0,x_02);
    local_170 = local_150;
    local_168 = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_171);
    PVar4 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,(ParameterInit *)&local_170,(string *)&ps,
                       dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(local_160._0_4_,hidden_dim);
    x_03._M_len = 2;
    x_03._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_03);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar5 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(hidden_dim,hidden_dim);
    x_04._M_len = 2;
    x_04._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_04);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar6 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(1,hidden_dim);
    x_05._M_len = 2;
    x_05._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_05);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar7 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_06._M_len = 1;
    x_06._M_array = &local_178;
    local_178 = hidden_dim;
    Dim::Dim((Dim *)local_d0,x_06);
    local_170 = local_150;
    local_168 = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_171);
    PVar8 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,(ParameterInit *)&local_170,(string *)&ps,
                       dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(local_160._0_4_,hidden_dim);
    x_07._M_len = 2;
    x_07._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_07);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    local_160 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_170 = (undefined **)CONCAT44(hidden_dim,hidden_dim);
    x_08._M_len = 2;
    x_08._M_array = (iterator)&local_170;
    Dim::Dim((Dim *)local_d0,x_08);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_178);
    PVar9 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_178 = local_154;
    x_09._M_len = 1;
    x_09._M_array = &local_178;
    Dim::Dim((Dim *)local_d0,x_09);
    local_170 = local_150;
    local_168 = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_171);
    PVar10 = ParameterCollection::add_parameters
                       (this_00,(Dim *)local_d0,(ParameterInit *)&local_170,(string *)&ps,
                        dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_d0._64_8_ = local_160;
    __l._M_len = 0xb;
    __l._M_array = (iterator)local_d0;
    local_d0._0_8_ = PVar1;
    local_d0._8_8_ = PVar2;
    local_d0._16_8_ = PVar3;
    local_d0._24_8_ = PVar4;
    local_d0._32_8_ = PVar5;
    local_d0._40_8_ = PVar6;
    local_d0._48_8_ = PVar7;
    local_d0._56_8_ = PVar8;
    local_88 = PVar9.p;
    local_80 = PVar10.p;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              (&ps,__l,(allocator_type *)&local_170);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back(&this->params,(value_type *)&ps);
    hidden_dim = local_154;
    std::_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~_Vector_base
              ((_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)&ps);
    local_160 = (ParameterStorage *)CONCAT44(local_160._4_4_,hidden_dim);
  }
  return;
}

Assistant:

FastLSTMBuilder::FastLSTMBuilder(unsigned layers,
                                 unsigned input_dim,
                                 unsigned hidden_dim,
                                 ParameterCollection& model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("fast-lstm-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2i = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2i = local_model.add_parameters({hidden_dim, 1});
    Parameter p_bi = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // o
    Parameter p_x2o = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2o = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2o = local_model.add_parameters({hidden_dim, 1});
    Parameter p_bo = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // c
    Parameter p_x2c = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2c = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bc = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}